

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall FPolyObj::ClosestPoint(FPolyObj *this,DVector2 *fpos,DVector2 *out,side_t **side)

{
  side_t *psVar1;
  line_t_conflict *plVar2;
  double dVar3;
  double dVar4;
  side_t *psVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar8 = INFINITY;
  psVar5 = (side_t *)0x0;
  for (uVar6 = 0; (this->Sidedefs).Count != uVar6; uVar6 = uVar6 + 1) {
    psVar1 = (this->Sidedefs).Array[uVar6];
    plVar2 = psVar1->linedef;
    bVar7 = plVar2->sidedef[0] == psVar1;
    dVar14 = **(double **)(plVar2->args + (ulong)bVar7 * 2 + -0xb);
    dVar16 = (*(double **)(plVar2->args + (ulong)bVar7 * 2 + -0xb))[1];
    dVar3 = **(double **)(plVar2->args + (ulong)!bVar7 * 2 + -0xb);
    dVar4 = (*(double **)(plVar2->args + (ulong)!bVar7 * 2 + -0xb))[1];
    dVar13 = dVar14 - dVar3;
    dVar15 = dVar16 - dVar4;
    dVar17 = dVar15 * dVar15 + dVar13 * dVar13;
    dVar11 = dVar3;
    dVar12 = dVar4;
    if ((((dVar17 != 0.0) || (NAN(dVar17))) &&
        (dVar17 = ((fpos->Y - dVar4) * dVar15 + (fpos->X - dVar3) * dVar13) / dVar17, 0.0 < dVar17))
       && (dVar11 = dVar14, dVar12 = dVar16, dVar17 < 1.0)) {
      dVar11 = dVar3 + dVar13 * dVar17;
      dVar12 = dVar4 + dVar15 * dVar17;
    }
    dVar14 = dVar11 - fpos->X;
    dVar16 = dVar12 - fpos->Y;
    dVar14 = dVar16 * dVar16 + dVar14 * dVar14;
    if (dVar8 <= dVar14) {
      dVar14 = dVar8;
      psVar1 = psVar5;
      dVar12 = dVar10;
      dVar11 = dVar9;
    }
    dVar9 = dVar11;
    dVar10 = dVar12;
    psVar5 = psVar1;
    dVar8 = dVar14;
  }
  out->X = dVar9;
  out->Y = dVar10;
  if (side != (side_t **)0x0) {
    *side = psVar5;
  }
  return;
}

Assistant:

void FPolyObj::ClosestPoint(const DVector2 &fpos, DVector2 &out, side_t **side) const
{
	unsigned int i;
	double x = fpos.X, y = fpos.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;
	side_t *bestline = NULL;

	for (i = 0; i < Sidedefs.Size(); ++i)
	{
		vertex_t *v1 = Sidedefs[i]->V1();
		vertex_t *v2 = Sidedefs[i]->V2();
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
			bestline = Sidedefs[i];
		}
	}
	out = { bestx, besty };
	if (side != NULL)
	{
		*side = bestline;
	}
}